

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgConstructSurrogate.hpp
# Opt level: O1

void TasGrid::constructCommon<false,false>
               (ModelSignature *model,size_t max_num_points,size_t num_parallel_jobs,
               size_t max_samples_per_job,TasmanianSparseGrid *grid,
               function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)>
               *candidates,string *checkpoint_filename)

{
  BaseCanonicalGrid *pBVar1;
  pointer pcVar2;
  double dVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  runtime_error *this;
  int iVar9;
  size_t __nbytes;
  void *__buf;
  void *__buf_00;
  size_type sVar10;
  long lVar11;
  size_t remaining_budget;
  undefined1 auVar12 [16];
  CompleteStorage complete;
  string filename_old;
  string filename;
  vector<double,_std::allocator<double>_> y;
  CandidateManager manager;
  ifstream infile;
  anon_class_24_3_de235a21 checkpoint;
  vector<double,_std::allocator<double>_> local_588;
  CompleteStorage local_570;
  ulong local_538;
  long *local_530 [2];
  long local_520 [2];
  long local_510;
  _Any_data *local_508;
  string local_500;
  vector<double,_std::allocator<double>_> local_4e0;
  size_t local_4c8;
  CandidateManager local_4c0;
  undefined1 local_448 [8];
  pointer pdStack_440;
  pointer pdStack_438;
  int aiStack_428 [54];
  ios_base local_350 [280];
  anon_class_24_3_de235a21 local_238 [21];
  
  __nbytes = max_samples_per_job + (max_samples_per_job == 0);
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    local_538 = 0;
    local_510 = 0;
    local_570.num_dimensions = local_538;
  }
  else {
    local_570.num_dimensions = (size_t)*(int *)(pBVar1 + 0x10);
    local_510 = (long)*(int *)(pBVar1 + 0x14);
  }
  local_4c0.num_candidates = 0;
  local_4c0.num_running = 0;
  local_4c0.num_done = 0;
  local_4c0.candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c0.candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c0.candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c0.sorted.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c0.sorted.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c0.sorted.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c0.status.
  super__Vector_base<TasGrid::CandidateManager::TypeStatus,_std::allocator<TasGrid::CandidateManager::TypeStatus>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c0.status.
  super__Vector_base<TasGrid::CandidateManager::TypeStatus,_std::allocator<TasGrid::CandidateManager::TypeStatus>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c0.status.
  super__Vector_base<TasGrid::CandidateManager::TypeStatus,_std::allocator<TasGrid::CandidateManager::TypeStatus>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c0.running_jobs.
  super__Fwd_list_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl._M_head._M_next =
       (_Fwd_list_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )(_Fwd_list_impl)0x0;
  local_570.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_570.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_570.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_570.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_570.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_570.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  pcVar2 = (checkpoint_filename->_M_dataplus)._M_p;
  local_538 = local_570.num_dimensions;
  local_508 = (_Any_data *)model;
  local_4c8 = max_num_points;
  local_4c0.num_dimensions = local_570.num_dimensions;
  local_4c0.num_batch = __nbytes;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_500,pcVar2,pcVar2 + checkpoint_filename->_M_string_length);
  local_530[0] = local_520;
  pcVar2 = (checkpoint_filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_530,pcVar2,pcVar2 + checkpoint_filename->_M_string_length);
  std::__cxx11::string::append((char *)local_530);
  if (local_500._M_string_length != 0) {
    std::ifstream::ifstream(local_448,(string *)&local_500,_S_bin);
    if (*(int *)((long)aiStack_428 + (long)*(pointer)((long)local_448 + -0x18)) != 0)
    goto LAB_0011b502;
    TasGrid::TasmanianSparseGrid::read((istream *)grid,SUB81(local_448,0));
    CompleteStorage::read(&local_570,(int)local_448,__buf,__nbytes);
    std::ifstream::~ifstream(local_448);
  }
  if (local_500._M_string_length != 0) {
    std::ofstream::ofstream(local_448,(string *)&local_500,_S_bin);
    TasGrid::TasmanianSparseGrid::write((ostream *)grid,SUB81(local_448,0));
    CompleteStorage::write(&local_570,(int)local_448,__buf_00,__nbytes);
    local_448 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_448 + (long)_VTT[-3]) = _sqrt;
    std::filebuf::~filebuf((filebuf *)&pdStack_440);
    std::ios_base::~ios_base(local_350);
  }
  local_238[0].complete = &local_570;
  uVar6 = (ulong)((long)local_570.points.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)local_570.points.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start >> 3) / local_570.num_dimensions;
  lVar11 = 0;
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 != (BaseCanonicalGrid *)0x0) {
    iVar9 = *(int *)(pBVar1 + 0x14);
    if (iVar9 != 0) {
      iVar9 = *(int *)(pBVar1 + 0x20);
    }
    lVar11 = (long)iVar9;
  }
  local_238[0].filename = &local_500;
  local_238[0].grid = grid;
  if (grid->using_dynamic_construction == false) {
    TasGrid::TasmanianSparseGrid::beginConstruction();
  }
  if (local_570.num_dimensions <=
      (ulong)((long)local_570.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_570.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    CompleteStorage::load(&local_570,grid);
  }
  if ((candidates->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*candidates->_M_invoker)
              ((vector<double,_std::allocator<double>_> *)local_448,(_Any_data *)candidates,grid);
    CandidateManager::operator=(&local_4c0,(vector<double,_std::allocator<double>_> *)local_448);
    if (local_448 != (undefined1  [8])0x0) {
      operator_delete((void *)local_448,(long)pdStack_438 - (long)local_448);
    }
    pBVar1 = (grid->base)._M_t.
             super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
    if (pBVar1 == (BaseCanonicalGrid *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = (size_type)*(int *)(pBVar1 + 0x10);
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&local_588,sVar10,(allocator_type *)local_448);
    pBVar1 = (grid->base)._M_t.
             super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
    if (pBVar1 == (BaseCanonicalGrid *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = (size_type)*(int *)(pBVar1 + 0x14);
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&local_4e0,sVar10,(allocator_type *)local_448);
    uVar6 = lVar11 + uVar6;
    while( true ) {
      remaining_budget = local_4c8 - uVar6;
      if ((local_4c8 < uVar6 || remaining_budget == 0) || (local_4c0.num_candidates == 0)) {
        if (local_570.num_dimensions <=
            (ulong)((long)local_570.points.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_570.points.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3)) {
          CompleteStorage::load(&local_570,grid);
        }
        if (local_4e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_4e0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_4e0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_588.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_588.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_530[0] != local_520) {
          operator_delete(local_530[0],local_520[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        CompleteStorage::~CompleteStorage(&local_570);
        CandidateManager::~CandidateManager(&local_4c0);
        return;
      }
      CandidateManager::next
                ((vector<double,_std::allocator<double>_> *)local_448,&local_4c0,remaining_budget);
      pdVar5 = local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar4 = local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_448;
      local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = pdStack_440;
      local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdStack_438;
      local_448 = (undefined1  [8])0x0;
      pdStack_440 = (pointer)0x0;
      pdStack_438 = (pointer)0x0;
      if (pdVar4 != (pointer)0x0) {
        operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
      }
      if (local_448 != (undefined1  [8])0x0) {
        operator_delete((void *)local_448,(long)pdStack_438 - (long)local_448);
      }
      if (local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
LAB_0011b236:
      if (local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar7 = (ulong)((long)local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) / local_538;
        std::vector<double,_std::allocator<double>_>::resize(&local_4e0,uVar7 * local_510);
        local_448 = (undefined1  [8])0x0;
        if (*(long *)(local_508 + 1) == 0) goto LAB_0011b4f8;
        (**(code **)(local_508->_M_pod_data + 0x18))
                  (local_508,&local_588,&local_4e0,(unsigned_long *)local_448);
        CompleteStorage::add(&local_570,&local_588,&local_4e0);
        CandidateManager::complete(&local_4c0,&local_588);
        pBVar1 = (grid->base)._M_t.
                 super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
        if (((pBVar1 == (BaseCanonicalGrid *)0x0) || (*(int *)(pBVar1 + 0x14) == 0)) ||
           (*(int *)(pBVar1 + 0x20) < 1000)) {
LAB_0011b347:
          if (local_570.num_dimensions <=
              (ulong)((long)local_570.points.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_570.points.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3)) {
            CompleteStorage::load(&local_570,grid);
          }
        }
        else {
          uVar8 = (ulong)((long)local_570.points.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_570.points.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) /
                  local_570.num_dimensions;
          if (pBVar1 == (BaseCanonicalGrid *)0x0) {
            dVar3 = 0.0;
          }
          else {
            iVar9 = *(int *)(pBVar1 + 0x14);
            if (iVar9 != 0) {
              iVar9 = *(int *)(pBVar1 + 0x20);
            }
            dVar3 = (double)iVar9;
          }
          auVar12._8_4_ = (int)(uVar8 >> 0x20);
          auVar12._0_8_ = uVar8;
          auVar12._12_4_ = 0x45300000;
          if (0.2 < ((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) / dVar3)
          goto LAB_0011b347;
        }
        uVar6 = uVar7 + uVar6;
        if (0.2 < (((double)CONCAT44(0x45300000,(int)(local_4c0.num_done >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_4c0.num_done) - 4503599627370496.0)) /
                  (((double)CONCAT44(0x45300000,(int)(local_4c0.num_candidates >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_4c0.num_candidates) - 4503599627370496.0))
           ) {
          if (local_570.num_dimensions <=
              (ulong)((long)local_570.points.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_570.points.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3)) {
            CompleteStorage::load(&local_570,grid);
          }
          if ((candidates->super__Function_base)._M_manager == (_Manager_type)0x0)
          goto LAB_0011b4f8;
          (*candidates->_M_invoker)
                    ((vector<double,_std::allocator<double>_> *)local_448,(_Any_data *)candidates,
                     grid);
          CandidateManager::operator=
                    (&local_4c0,(vector<double,_std::allocator<double>_> *)local_448);
          if (local_448 != (undefined1  [8])0x0) {
            operator_delete((void *)local_448,(long)pdStack_438 - (long)local_448);
          }
        }
      }
      constructCommon<false,_false>::anon_class_24_3_de235a21::operator()(local_238);
    }
    if (local_570.num_dimensions <=
        (ulong)((long)local_570.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_570.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3)) {
      CompleteStorage::load(&local_570,grid);
    }
    if ((candidates->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*candidates->_M_invoker)
                ((vector<double,_std::allocator<double>_> *)local_448,(_Any_data *)candidates,grid);
      CandidateManager::operator=(&local_4c0,(vector<double,_std::allocator<double>_> *)local_448);
      if (local_448 != (undefined1  [8])0x0) {
        operator_delete((void *)local_448,(long)pdStack_438 - (long)local_448);
      }
      CandidateManager::next
                ((vector<double,_std::allocator<double>_> *)local_448,&local_4c0,remaining_budget);
      pdVar5 = local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar4 = local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_448;
      local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = pdStack_440;
      local_588.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdStack_438;
      local_448 = (undefined1  [8])0x0;
      pdStack_440 = (pointer)0x0;
      pdStack_438 = (pointer)0x0;
      if (pdVar4 != (pointer)0x0) {
        operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
      }
      if (local_448 != (undefined1  [8])0x0) {
        operator_delete((void *)local_448,(long)pdStack_438 - (long)local_448);
      }
      goto LAB_0011b236;
    }
LAB_0011b4f8:
    std::__throw_bad_function_call();
  }
  std::__throw_bad_function_call();
LAB_0011b502:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"missing main checkpoint");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void constructCommon(ModelSignature model,
                     size_t max_num_points, size_t num_parallel_jobs, size_t max_samples_per_job,
                     TasmanianSparseGrid &grid,
                     std::function<std::vector<double>(TasmanianSparseGrid &)> candidates,
                     std::string const &checkpoint_filename){

    num_parallel_jobs   = std::max(size_t(1), num_parallel_jobs);
    max_samples_per_job = std::max(size_t(1), max_samples_per_job);
    size_t num_dimensions = (size_t) grid.getNumDimensions();
    size_t num_outputs    = (size_t) grid.getNumOutputs();
    CandidateManager manager(num_dimensions, max_samples_per_job); // keeps track of started and ordered samples
    CompleteStorage complete(num_dimensions); // temporarily stores complete samples (batch loading is faster)

    std::string filename = checkpoint_filename;
    std::string filename_old = checkpoint_filename + "_old";

    if (!filename.empty()){ // recover from an existing checkpoint
        std::ifstream infile(filename, std::ios::binary);
        try{ // attempt to recover from filename
            if (!infile.good()) throw std::runtime_error("missing main checkpoint");
            grid.read(infile, mode_binary);
            complete.read(infile);
        }catch(std::runtime_error &){
            // main file is missing or is corrupt, try the older version
            std::ifstream oldfile(filename_old, std::ios::binary);
            try{
                if (!oldfile.good()) throw std::runtime_error("missing main checkpoint");
                grid.read(oldfile, mode_binary);
                complete.read(oldfile);
            }catch(std::runtime_error &){
                // nothing could be recovered, start over from the current grid
            }
        }
    }

    if (!filename.empty()){ // initial checkpoint
        std::ofstream ofs(filename, std::ios::binary);
        grid.write(ofs, mode_binary); // write grid to current
        complete.write(ofs);
    }

    // prepare several commonly used steps
    auto checkpoint = [&]()->void{ // keeps two saved states for the constructed grid
        if (!filename.empty()){
            { // copy current into old and write to current
                std::ifstream current_state(filename, std::ios::binary);
                std::ofstream previous_state(filename, std::ios::binary);
                previous_state << current_state.rdbuf();
            }
            std::ofstream ofs(filename, std::ios::binary);
            grid.write(ofs, mode_binary); // write grid to current
            complete.write(ofs);
        }
    };

    auto load_complete = [&]()->void{ // loads any complete points, does nothing if getNumStored() is zero
        if (complete.getNumStored() > 0)
            complete.load(grid);
    };

    auto refresh_candidates = [&]()->void{ // loads complete and asks for new candidates
        load_complete(); // always load before computing new candidates
        manager = candidates(grid); // get new candidates
    };

    size_t total_num_launched = complete.getNumStored() + grid.getNumLoaded(); // count all launched jobs, including the ones already complete
    auto checkout_sample = [&]()->std::vector<double>{ // get the "most-important" point that has not started yet
        auto x = manager.next(max_num_points - total_num_launched);
        if (x.empty()){ // did not find a job, maybe we need to refresh the candidates
            refresh_candidates();
            x = manager.next(max_num_points - total_num_launched); // if this is empty, then we have exhausted all possible candidates
        }
        return x;
    };

    // load the initial guess into y (is using initial guess), otherwise set y to the correct size
    auto set_initial_guess = [&](std::vector<double> const &x, std::vector<double> &y)->void{
        if (use_initial_guess){
            if (grid.getNumLoaded()) grid.evaluateBatch(x, y);
            else y.clear();
        }else{
            y.resize(num_outputs * (x.size() / num_dimensions));
        }
    };

    if (!grid.isUsingConstruction()) // the procedure assumes dynamic construction
        grid.beginConstruction();

    refresh_candidates();

    if (parallel_construction == mode_parallel){ // parallel version
        // allocate space for all x and y pairs, will be filled by workers and processed by main
        std::vector<std::vector<double>> x(num_parallel_jobs),
                                         y(num_parallel_jobs, std::vector<double>(max_samples_per_job * num_outputs));

        std::vector<int> work_flag(num_parallel_jobs);
        constexpr int flag_done = 0;
        constexpr int flag_computing = 1;
        constexpr int flag_shutdown = 2;

        std::condition_variable until_someone_done;
        std::condition_variable until_new_job;
        std::mutex access_count_done;
        int count_done = 0;

        // lambda that will handle the work
        auto do_work = [&](size_t thread_id)->void{

            int my_flag = flag_computing;
            while(my_flag == flag_computing){
                model(x[thread_id], y[thread_id], thread_id); // does the model evaluations

                { // must guarantee sync between work_flag and count_done, use a lock
                    std::lock_guard<std::mutex> lock(access_count_done);
                    work_flag[thread_id] = flag_done;
                    count_done++;
                }
                until_someone_done.notify_one(); // just finished some work, notify the main thread

                { // wait till the main thread gives us an new piece of work
                    std::unique_lock<std::mutex> lock(access_count_done);
                    until_new_job.wait(lock, [&]()->bool{ return (work_flag[thread_id] != flag_done); });
                    my_flag = work_flag[thread_id];
                }
            }
        };

        // launch initial set of jobs
        std::vector<std::thread> workers(num_parallel_jobs);
        for(size_t id=0; id<num_parallel_jobs; id++){
            x[id] = manager.next(max_num_points - total_num_launched);
            if (!x[id].empty()){
                total_num_launched += x[id].size() / num_dimensions;
                set_initial_guess(x[id], y[id]);
                work_flag[id] = flag_computing;
                workers[id] = std::thread(do_work, id);
            }else{
                work_flag[id] = flag_shutdown; // not enough samples, cancel the thread
            }
        }

        auto collect_finished = [&]()->bool{
            bool any_done = false;
            for(size_t id=0; id<num_parallel_jobs; id++){
                if (work_flag[id] == flag_done){
                    if (!x.empty()){ // shouldn't be empty
                        complete.add(x[id], y[id]);
                        manager.complete(x[id]);
                        any_done = true;
                    }
                    if ((grid.getNumLoaded() < 1000) || (double(complete.getNumStored()) / double(grid.getNumLoaded()) > 0.2))
                        load_complete(); // move from complete into the grid

                    if (total_num_launched < max_num_points){
                        // refresh the candidates if enough of the current candidates have completed
                        if (double(manager.getNumDone()) / double(manager.getNumCandidates()) > 0.2)
                            refresh_candidates();

                        x[id] = checkout_sample(); // if necessary this will call refresh_candidates()

                        if (!x[id].empty()){ // if empty, then we have finished all possible candidates (reached tolerance)
                            total_num_launched += x[id].size() / num_dimensions;
                            set_initial_guess(x[id], y[id]);
                            work_flag[id] = flag_computing;
                        }else{
                            work_flag[id] = flag_shutdown; // not enough samples, cancel the thread
                        }
                    }else{
                        work_flag[id] = flag_shutdown; // reached the budget, shutdown the thread
                    }
                }
            }
            return any_done;
        };

        while(manager.getNumRunning() > 0){ // main loop
            {   // lock access to the count_done variable
                std::unique_lock<std::mutex> lock(access_count_done);
                // unlock and wait until some else increments the "done" count
                until_someone_done.wait(lock, [&]()->bool{ return (count_done > 0); });
                // the lock is back on at this point, process the completed samples, reset the count and go back to waiting
                count_done = 0;
                if (collect_finished()) checkpoint(); // if new samples were computed, save the state
            } // unlock the access_count_done and notify that we have loaded new jobs
            // without the unlock, the threads will wake up but will not be able to read the worker flags
            until_new_job.notify_all();
        }

        load_complete(); // flush completed jobs

        for(auto &w : workers) if (w.joinable()) w.join(); // join all threads

    }else{
        std::vector<double> x(grid.getNumDimensions()), y( grid.getNumOutputs());

        while((total_num_launched < max_num_points) && (manager.getNumCandidates() > 0)){
            x = manager.next(max_num_points - total_num_launched);
            if (x.empty()){ // need more candidates
                refresh_candidates();
                x = manager.next(max_num_points - total_num_launched); // if this is empty, then we have exhausted the candidates
            }
            if (!x.empty()){ // could be empty if there are no more candidates
                total_num_launched += x.size() / num_dimensions;
                set_initial_guess(x, y);
                model(x, y, 0); // compute a sample
                complete.add(x, y);
                manager.complete(x);

                // the fist thousand points can be loaded one at a time, then add when % increase of the grid is achieved
                if ((grid.getNumLoaded() < 1000) || (double(complete.getNumStored()) / double(grid.getNumLoaded()) > 0.2))
                    load_complete(); // also does checkpoint save
                // if done with the top % of the grid points, recompute the candidates
                if (double(manager.getNumDone()) / double(manager.getNumCandidates()) > 0.2)
                    refresh_candidates();
            }
            checkpoint();
        }

        load_complete(); // flush completed jobs
    }
}